

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O0

JavascriptString * Js::TaggedInt::ToString(Var aValue,ScriptContext *scriptContext)

{
  int32 value;
  JavascriptString *pJVar1;
  ScriptContext *scriptContext_local;
  Var aValue_local;
  
  value = ToInt32(aValue);
  pJVar1 = ToString(value,scriptContext);
  return pJVar1;
}

Assistant:

JavascriptString* TaggedInt::ToString(Var aValue,ScriptContext* scriptContext)
    {
        return ToString(ToInt32(aValue), scriptContext);
    }